

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

void __thiscall fasttext::Dictionary::initNgrams(Dictionary *this)

{
  reference pvVar1;
  long in_RDI;
  vector<fasttext::entry,_std::allocator<fasttext::entry>_> *this_00;
  subentry sm;
  subentry sl;
  size_t i;
  vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *in_stack_00000328;
  subentry *in_stack_00000330;
  vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *in_stack_00000338;
  vector<int,_std::allocator<int>_> *in_stack_00000340;
  string *in_stack_00000348;
  Dictionary *in_stack_00000350;
  vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *in_stack_00000360;
  subentry *in_stack_ffffffffffffff38;
  subentry *in_stack_ffffffffffffff40;
  ulong local_10;
  
  for (local_10 = 0; local_10 < (ulong)(long)*(int *)(in_RDI + 0x88); local_10 = local_10 + 1) {
    this_00 = (vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)(in_RDI + 0x58);
    std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[](this_00,local_10);
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x15247c);
    std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[](this_00,local_10);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff40,
               (value_type_conflict *)in_stack_ffffffffffffff38);
    subentry::subentry((subentry *)0x1524c2);
    subentry::subentry((subentry *)0x1524cc);
    std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[](this_00,local_10);
    subentry::operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    in_stack_ffffffffffffff40 = (subentry *)(in_RDI + 0x58);
    std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[]
              ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)
               in_stack_ffffffffffffff40,local_10);
    std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[]
              ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)
               in_stack_ffffffffffffff40,local_10);
    std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[]
              ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)
               in_stack_ffffffffffffff40,local_10);
    std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[]
              ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)
               in_stack_ffffffffffffff40,local_10);
    std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[]
              ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)
               in_stack_ffffffffffffff40,local_10);
    pvVar1 = std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[]
                       ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)
                        in_stack_ffffffffffffff40,local_10);
    in_stack_ffffffffffffff38 = (subentry *)&pvVar1->subipangram;
    computeNgrams(in_stack_00000350,in_stack_00000348,in_stack_00000340,in_stack_00000338,
                  in_stack_00000330,in_stack_00000328,in_stack_00000360);
    subentry::~subentry((subentry *)0x1525d3);
    subentry::~subentry((subentry *)0x1525e0);
  }
  return;
}

Assistant:

void Dictionary::initNgrams() {
  for (size_t i = 0; i < size_; i++) {
  	 words_[i].subwords.clear();
 	 words_[i].subwords.push_back(i);
	 subentry sl;
	 subentry sm;
         words_[i].sublemma = sl;
   	 computeNgrams(words_[i].actual_word, words_[i].subwords, words_[i].subngram,words_[i].sublemma,words_[i].submorph,words_[i].subipangram);
  }
}